

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O3

void event_wake_up(tgestate_t *state)

{
  uint8_t *puVar1;
  byte bVar2;
  route_t route;
  long lVar3;
  
  state->bell = '(';
  queue_message(state,message_TIME_TO_WAKE_UP);
  if (state->hero_in_bed != '\0') {
    state->vischars[0].mi.mappos.u = 0x2e;
    state->vischars[0].mi.mappos.v = 0x2e;
  }
  state->hero_in_bed = '\0';
  if (state->in_solitary == '\0') {
    puVar1 = &state->vischars[0].flags;
    *puVar1 = *puVar1 & 0xbf;
    state->vischars[0].route.index = '*';
    state->vischars[0].route.step = '\0';
    set_route(state,state->vischars);
  }
  state->character_structs[0x14].room = '\x03';
  state->character_structs[0x15].room = '\x03';
  state->character_structs[0x16].room = '\x03';
  bVar2 = 5;
  state->character_structs[0x17].room = '\x05';
  state->character_structs[0x18].room = '\x05';
  state->character_structs[0x19].room = '\x05';
  lVar3 = 0;
  do {
    route.step = '\0';
    route.index = bVar2;
    set_character_route(state,"\f\r\x14\x15\x16\x0e\x0f\x17\x18\x19"[lVar3],route);
    bVar2 = bVar2 + ((char)lVar3 == '\x04');
    lVar3 = lVar3 + 1;
  } while ((char)lVar3 != '\n');
  lVar3 = 0;
  do {
    set_roomdef(state,beds[lVar3].room_index,(uint)beds[lVar3].offset,9);
    lVar3 = lVar3 + 1;
  } while ((char)lVar3 != '\x06');
  set_roomdef(state,'\x02',0x1a,9);
  if ((byte)(state->room_index - 1) < 5) {
    setup_room(state);
    plot_interior_tiles(state);
    return;
  }
  return;
}

Assistant:

static void event_wake_up(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  queue_message(state, message_TIME_TO_WAKE_UP);
  wake_up(state);
}